

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  Http *this;
  int extraout_EDX;
  int extraout_EDX_00;
  int __n;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  signal(0xf,onSignalReceived);
  signal(2,onSignalReceived);
  signal(0xe,onSignalReceived);
  this = (Http *)operator_new(8);
  MNS::Http::Http(this);
  server = MNS::Http::createServer(this);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(MNS::SocketData_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Helidium[P]Mitol/main.cpp:20:27)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(MNS::SocketData_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Helidium[P]Mitol/main.cpp:20:27)>
             ::_M_manager;
  MNS::Server::onHttpConnection(server,(function<void_(MNS::SocketData_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(MNS::SocketData_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Helidium[P]Mitol/main.cpp:23:24)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(MNS::SocketData_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Helidium[P]Mitol/main.cpp:23:24)>
             ::_M_manager;
  MNS::Server::onHttpRequest(server,(function<void_(MNS::SocketData_*)> *)&local_38);
  __n = extraout_EDX;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
    __n = extraout_EDX_00;
  }
  MNS::Server::listen(server,0x1f90,__n);
  MNS::Server::run(server);
  MNS::Http::~Http(this);
  operator_delete(this);
  return 0;
}

Assistant:

int main() {
	signal(SIGTERM, onSignalReceived);
	signal(SIGINT, onSignalReceived);
	signal(SIGALRM, onSignalReceived);

	MNS::Http *http = new MNS::Http();
	server = http->createServer();
	server->onHttpConnection([](MNS::SocketData *data) {
	});

	server->onHttpRequest([](MNS::SocketData *data) {
		MNS::Response *response = data->response;

		response->end("Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!Hello world!", 120);
	});
	server->listen(8080);
	server->run();

	delete (http);
	return 0;
}